

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall DifferingTypesTest::nonBasicTypesTest(DifferingTypesTest *this)

{
  undefined1 local_d8 [8];
  View<MyTestType,_false,_std::allocator<unsigned_long>_> v;
  size_t base [2];
  allocator<MyTestType> local_72;
  MyTestType local_71;
  undefined1 local_70 [8];
  Marray<MyTestType,_std::allocator<unsigned_long>_> m;
  size_t shape [2];
  DifferingTypesTest *this_local;
  
  m._64_8_ = 3;
  shape[0] = 4;
  std::allocator<MyTestType>::allocator(&local_72);
  andres::Marray<MyTestType,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<MyTestType,std::allocator<unsigned_long>> *)local_70,
             (unsigned_long *)&m.field_0x40,shape + 1,&local_71,&andres::defaultOrder,&local_72);
  std::allocator<MyTestType>::~allocator(&local_72);
  v.geometry_.coordinateOrder_ = FirstMajorOrder;
  v.geometry_.isSimple_ = false;
  v.geometry_._53_3_ = 0;
  m._64_8_ = 2;
  shape[0] = 2;
  andres::View<MyTestType,false,std::allocator<unsigned_long>>::view<unsigned_long*,unsigned_long*>
            ((View<MyTestType,_false,_std::allocator<unsigned_long>_> *)local_d8,
             (View<MyTestType,false,std::allocator<unsigned_long>> *)local_70,
             (unsigned_long *)&v.geometry_.coordinateOrder_,(unsigned_long *)&m.field_0x40);
  andres::View<MyTestType,false,std::allocator<unsigned_long>>::operator()
            ((View<MyTestType,false,std::allocator<unsigned_long>> *)local_d8,0,1);
  andres::View<MyTestType,_false,_std::allocator<unsigned_long>_>::~View
            ((View<MyTestType,_false,_std::allocator<unsigned_long>_> *)local_d8);
  andres::Marray<MyTestType,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<MyTestType,_std::allocator<unsigned_long>_> *)local_70);
  return;
}

Assistant:

void DifferingTypesTest::nonBasicTypesTest()
{
    std::size_t shape[] = {3, 4};
    andres::Marray<MyTestType> m(shape, shape + 2);
    std::size_t base[] = {0, 0};
    shape[0] = 2;
    shape[1] = 2;
    andres::View<MyTestType> v = m.view(base, shape);
    v(0, 1) = MyTestType();
}